

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::spinlock::lock(spinlock *this)

{
  int iVar1;
  pthread_spinlock_t *in_RDI;
  uint in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  
  iVar1 = pthread_spin_lock(in_RDI);
  if (iVar1 != 0) {
    crnlib_fail(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  return;
}

Assistant:

void spinlock::lock() {
#if !defined(__APPLE__)
  if (pthread_spin_lock(&m_spinlock)) {
    CRNLIB_FAIL("spinlock: pthread_spin_lock() failed");
  }
#else
  os_unfair_lock_lock(m_lock);
#endif
}